

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

void __thiscall Klex::skipWhitespace(Klex *this)

{
  int iVar1;
  
  do {
    iVar1 = this->currentChar << 0x18;
    if ((this->currentChar & 0xfbU) == 9) {
      if (iVar1 == 0xa000000) {
LAB_0010a996:
        this->lineNum = this->lineNum + 1;
        this->colNum = 0;
      }
    }
    else {
      if (iVar1 == 0xa000000) goto LAB_0010a996;
      if (iVar1 != 0x20000000) {
        return;
      }
    }
    nextChar(this);
  } while( true );
}

Assistant:

void Klex::skipWhitespace() {
    char c = getChar();

    while(c == ' ' || c == '\t' || c == '\n' || c == '\r') {
        if(c == '\n') {
            lineNum++;
            colNum = 0;
        }

        nextChar();
        c = getChar();
    }
}